

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O0

StringTree * __thiscall
kj::
strTree<kj::StringTree,kj::StringTree,char_const(&)[13],kj::StringPtr&,char_const(&)[12],kj::String&,char_const(&)[12],kj::String&,char_const(&)[59],unsigned_int&,char_const(&)[38],kj::StringTree,char_const(&)[13],kj::StringPtr&,char_const(&)[13],kj::String&,char_const(&)[6],kj::String&,char_const(&)[60],unsigned_int&,char_const(&)[38],kj::StringTree,kj::StringTree,char_const(&)[8],capnp::(anonymous_namespace)::CppTypeName&,char_const(&)[2],kj::StringPtr&,char_const(&)[12],kj::String&,char_const(&)[12],kj::String&,char_const(&)[37],capnp::(anonymous_namespace)::CppTypeName&,char_const(&)[56],unsigned_int&,char_const(&)[25],kj::String&,char_const(&)[6],kj::StringTree,char_const(&)[8],capnp::(anonymous_namespace)::CppTypeName&,char_const(&)[2],kj::StringPtr&,char_const(&)[13],kj::String&,char_const(&)[6],kj::String&,char_const(&)[37],capnp::(anonymous_namespace)::CppTypeName&,char_const(&)[57],unsigned_int&,char_const(&)[25],kj::String&,char_const(&)[6],kj::StringTree,kj::StringTree,char_const(&)[13],kj::StringPtr&,char_const(&)[13],kj::String&,char_const(&)[2],capnp::(anonymous_namespace)::CppTypeName&,char_const(&)[11],kj::String&,char_const(&)[30],capnp::(anonymous_namespace)::CppTypeName&,char_const(&)[57],unsigned_int&,char_const(&)[37],kj::StringTree,kj::StringTree,kj::StringTree,kj::StringTree,char_const(&)[13],kj::StringPtr&,char_const(&)[15],kj::String&,char_const(&)[23],capnp::(anonymous_namespace)::CppTypeName&,char_const(&)[14],kj::String&,char_const(&)[30],capnp::(anonymous_namespace)::CppTypeName&,char_const(&)[59],unsigned_int&,char_const(&)[45],kj::StringTree,kj::StringTree,char_const(&)[24],capnp::(anonymous_namespace)::CppTypeName&,char_const(&)[3],kj::StringPtr&,char_const(&)[16],kj::String&,char_const(&)[6],kj::String&,char_const(&)[37],capnp::(anonymous_namespace)::CppTypeName&,char_const(&)[60],unsigned_int&,char_const(&)[30],kj::StringTree,kj::StringTree,char_const(&)[2]>
          (StringTree *__return_storage_ptr__,kj *this,char (*params) [13],StringPtr *params_1,
          char (*params_2) [12],char (*params_3) [12],String *params_4,char (*params_5) [12],
          String *params_6,char (*params_7) [59],uint *params_8,char (*params_9) [38],
          NoInfer<kj::StringTree> *params_10,char (*params_11) [13],StringPtr *params_12,
          char (*params_13) [13],String *params_14,char (*params_15) [6],String *params_16,
          char (*params_17) [60],uint *params_18,char (*params_19) [38],
          NoInfer<kj::StringTree> *params_20,NoInfer<kj::StringTree> *params_21,
          char (*params_22) [8],CppTypeName *params_23,char (*params_24) [2],StringPtr *params_25,
          char (*params_26) [12],String *params_27,char (*params_28) [12],String *params_29,
          char (*params_30) [37],CppTypeName *params_31,char (*params_32) [56],uint *params_33,
          char (*params_34) [25],String *params_35,char (*params_36) [6],
          NoInfer<kj::StringTree> *params_37,char (*params_38) [8],CppTypeName *params_39,
          char (*params_40) [2],StringPtr *params_41,char (*params_42) [13],String *params_43,
          char (*params_44) [6],String *params_45,char (*params_46) [37],CppTypeName *params_47,
          char (*params_48) [57],uint *params_49,char (*params_50) [25],String *params_51,
          char (*params_52) [6],NoInfer<kj::StringTree> *params_53,
          NoInfer<kj::StringTree> *params_54,char (*params_55) [13],StringPtr *params_56,
          char (*params_57) [13],String *params_58,char (*params_59) [2],CppTypeName *params_60,
          char (*params_61) [11],String *params_62,char (*params_63) [30],CppTypeName *params_64,
          char (*params_65) [57])

{
  StringTree *pSVar1;
  char (*pacVar2) [13];
  StringPtr *pSVar3;
  char (*pacVar4) [12];
  String *pSVar5;
  char (*pacVar6) [59];
  _ *p_Var7;
  char (*pacVar8) [38];
  char (*pacVar9) [6];
  char (*pacVar10) [60];
  char (*pacVar11) [8];
  CppTypeName *pCVar12;
  char (*pacVar13) [2];
  char (*pacVar14) [37];
  char (*value) [56];
  char (*pacVar15) [25];
  char (*pacVar16) [57];
  char (*value_00) [11];
  char (*pacVar17) [30];
  char (*value_01) [15];
  char (*value_02) [23];
  char (*value_03) [14];
  char (*value_04) [45];
  char (*value_05) [24];
  char (*value_06) [3];
  char (*value_07) [16];
  uint *value_08;
  uint *value_09;
  CppTypeName *value_10;
  CppTypeName *value_11;
  uint *value_12;
  CppTypeName *value_13;
  CppTypeName *value_14;
  uint *value_15;
  CppTypeName *value_16;
  CppTypeName *value_17;
  uint *value_18;
  CppTypeName *value_19;
  CppTypeName *value_20;
  uint *value_21;
  CppTypeName *value_22;
  CppTypeName *value_23;
  uint *value_24;
  ArrayPtr<const_char> AVar18;
  uint *in_stack_000001f8;
  char (*in_stack_00000200) [37];
  NoInfer<kj::StringTree> *in_stack_00000208;
  NoInfer<kj::StringTree> *in_stack_00000210;
  NoInfer<kj::StringTree> *in_stack_00000218;
  NoInfer<kj::StringTree> *in_stack_00000220;
  char (*in_stack_00000228) [13];
  StringPtr *in_stack_00000230;
  char (*in_stack_00000238) [15];
  String *in_stack_00000240;
  char (*in_stack_00000248) [23];
  CppTypeName *in_stack_00000250;
  char (*in_stack_00000258) [14];
  String *in_stack_00000260;
  char (*in_stack_00000268) [30];
  CppTypeName *in_stack_00000270;
  char (*in_stack_00000278) [59];
  uint *in_stack_00000280;
  char (*in_stack_00000288) [45];
  NoInfer<kj::StringTree> *in_stack_00000290;
  NoInfer<kj::StringTree> *in_stack_00000298;
  char (*in_stack_000002a0) [24];
  CppTypeName *in_stack_000002a8;
  char (*in_stack_000002b0) [3];
  StringPtr *in_stack_000002b8;
  char (*in_stack_000002c0) [16];
  String *in_stack_000002c8;
  char (*in_stack_000002d0) [6];
  String *in_stack_000002d8;
  char (*in_stack_000002e0) [37];
  CppTypeName *in_stack_000002e8;
  char (*in_stack_000002f0) [60];
  uint *in_stack_000002f8;
  char (*in_stack_00000300) [30];
  NoInfer<kj::StringTree> *in_stack_00000308;
  NoInfer<kj::StringTree> *in_stack_00000310;
  char (*in_stack_00000318) [2];
  ArrayPtr<const_char> *local_d88;
  ArrayPtr<const_char> *local_d80;
  ArrayPtr<const_char> *local_d78;
  ArrayPtr<const_char> *local_d70;
  CappedArray<char,_14UL> *local_d68;
  ArrayPtr<const_char> *local_d60;
  StringTree *local_d58;
  ArrayPtr<const_char> *local_d50;
  ArrayPtr<const_char> *local_d48;
  ArrayPtr<const_char> *local_d40;
  ArrayPtr<const_char> *local_d38;
  ArrayPtr<const_char> *local_d30;
  ArrayPtr<const_char> *local_d28;
  ArrayPtr<const_char> *local_d20;
  CappedArray<char,_14UL> *local_d18;
  ArrayPtr<const_char> *local_d10;
  StringTree *local_d08;
  StringTree *local_d00;
  ArrayPtr<const_char> *local_cf8;
  String *local_cf0;
  char **local_ce8;
  char **local_ce0;
  char **local_cd8;
  char **local_cd0;
  char **local_cc8;
  char **local_cc0;
  char **local_cb8;
  String *local_cb0;
  char **local_ca8;
  CappedArray<char,_14UL> *local_ca0;
  char **local_c98;
  char **local_c90;
  char **local_c88;
  StringTree *local_c80;
  char **local_c78;
  String *local_c70;
  char **local_c68;
  char **local_c60;
  char **local_c58;
  char **local_c50;
  char **local_c48;
  char **local_c40;
  char **local_c38;
  String *local_c30;
  char **local_c28;
  CappedArray<char,_14UL> *local_c20;
  char **local_c18;
  char **local_c10;
  char **local_c08;
  StringTree *local_c00;
  StringTree *local_bf8;
  char **local_bf0;
  char **local_be8;
  char **local_be0;
  char **local_bd8;
  char **local_bd0;
  String *local_bc8;
  char **local_bc0;
  char **local_bb8;
  char **local_bb0;
  String *local_ba8;
  char **local_ba0;
  CappedArray<char,_14UL> *local_b98;
  char **local_b90;
  StringTree *local_b88;
  StringTree *local_b80;
  StringTree *local_b78;
  StringTree *local_b70;
  char **local_b68;
  char **local_b60;
  char **local_b58;
  char **local_b50;
  char **local_b48;
  String *local_b40;
  char **local_b38;
  char **local_b30;
  char **local_b28;
  String *local_b20;
  char **local_b18;
  CappedArray<char,_14UL> *local_b10;
  char **local_b08;
  StringTree *local_b00;
  StringTree *local_af8;
  char **local_af0;
  String *local_ae8;
  char **local_ae0;
  char **local_ad8;
  char **local_ad0;
  char **local_ac8;
  char **local_ac0;
  char **local_ab8;
  char **local_ab0;
  String *local_aa8;
  char **local_aa0;
  CappedArray<char,_14UL> *local_a98;
  char **local_a90;
  StringTree *local_a88;
  StringTree *local_a80;
  char **local_a78;
  undefined1 *local_a70;
  StringTree *local_a68;
  StringTree *local_a60;
  size_t local_a58;
  char *local_a50;
  size_t local_a48;
  char *local_a40;
  size_t local_a38;
  char *local_a30;
  size_t local_a28;
  char *local_a20;
  size_t local_a18;
  char *local_a10;
  size_t local_a08;
  char *local_a00;
  size_t local_9f8;
  char *local_9f0;
  size_t local_9e8;
  char *local_9e0;
  size_t local_9d8;
  char *local_9d0;
  size_t local_9c8;
  char *local_9c0;
  StringTree *local_9b8;
  StringTree *local_9b0;
  size_t local_9a8;
  char *local_9a0;
  size_t local_998;
  char *local_990;
  size_t local_988;
  char *local_980;
  size_t local_978;
  char *local_970;
  size_t local_968;
  char *local_960;
  size_t local_958;
  char *local_950;
  size_t local_948;
  char *local_940;
  size_t local_938;
  char *local_930;
  size_t local_928;
  char *local_920;
  size_t local_918;
  char *local_910;
  StringTree *local_908;
  StringTree *local_900;
  StringTree *local_8f8;
  StringTree *local_8f0;
  size_t local_8e8;
  char *local_8e0;
  size_t local_8d8;
  char *local_8d0;
  size_t local_8c8;
  char *local_8c0;
  size_t local_8b8;
  char *local_8b0;
  size_t local_8a8;
  char *local_8a0;
  size_t local_898;
  char *local_890;
  size_t local_888;
  char *local_880;
  size_t local_878;
  char *local_870;
  size_t local_868;
  char *local_860;
  size_t local_858;
  char *local_850;
  StringTree *local_848;
  StringTree *local_840;
  size_t local_838;
  char *local_830;
  size_t local_828;
  char *local_820;
  size_t local_818;
  char *local_810;
  size_t local_808;
  char *local_800;
  size_t local_7f8;
  char *local_7f0;
  size_t local_7e8;
  char *local_7e0;
  size_t local_7d8;
  char *local_7d0;
  size_t local_7c8;
  char *local_7c0;
  size_t local_7b8;
  char *local_7b0;
  size_t local_7a8;
  char *local_7a0;
  size_t local_798;
  char *local_790;
  size_t local_788;
  char *local_780;
  StringTree *local_778;
  size_t local_770;
  char *local_768;
  size_t local_760;
  char *local_758;
  size_t local_750;
  char *local_748;
  size_t local_740;
  char *local_738;
  size_t local_730;
  char *local_728;
  size_t local_720;
  char *local_718;
  size_t local_710;
  char *local_708;
  size_t local_700;
  char *local_6f8;
  size_t local_6f0;
  char *local_6e8;
  size_t local_6e0;
  char *local_6d8;
  size_t local_6d0;
  char *local_6c8;
  StringTree *local_6c0;
  StringTree *local_6b8;
  StringTree *local_6b0;
  StringTree *local_6a8;
  StringTree *local_6a0;
  StringTree *local_698;
  StringTree *local_690;
  size_t local_688;
  char *local_680;
  char *local_678;
  size_t local_670;
  char *local_668;
  size_t local_660;
  CappedArray<char,_14UL> local_658;
  char *local_640;
  size_t local_638;
  String local_630;
  char *local_618;
  size_t local_610;
  char *local_608;
  size_t local_600;
  char *local_5f8;
  size_t local_5f0;
  char *local_5e8;
  size_t local_5e0;
  char *local_5d8;
  size_t local_5d0;
  char *local_5c8;
  size_t local_5c0;
  char *local_5b8;
  size_t local_5b0;
  String local_5a8;
  char *local_590;
  size_t local_588;
  char *local_580;
  size_t local_578;
  CappedArray<char,_14UL> local_570;
  char *local_558;
  size_t local_550;
  String local_548;
  char *local_530;
  size_t local_528;
  char *local_520;
  size_t local_518;
  char *local_510;
  size_t local_508;
  String local_500;
  char *local_4e8;
  size_t local_4e0;
  char *local_4d8;
  size_t local_4d0;
  char *local_4c8;
  size_t local_4c0;
  char *local_4b8;
  size_t local_4b0;
  char *local_4a8;
  size_t local_4a0;
  char *local_498;
  size_t local_490;
  CappedArray<char,_14UL> local_488;
  char *local_470;
  size_t local_468;
  String local_460;
  char *local_448;
  size_t local_440;
  char *local_438;
  size_t local_430;
  char *local_428;
  size_t local_420;
  String local_418;
  char *local_400;
  size_t local_3f8;
  char *local_3f0;
  size_t local_3e8;
  char *local_3e0;
  size_t local_3d8;
  char *local_3d0;
  size_t local_3c8;
  char *local_3c0;
  size_t local_3b8;
  char *local_3b0;
  size_t local_3a8;
  char *local_3a0;
  size_t local_398;
  char *local_390;
  size_t local_388;
  CappedArray<char,_14UL> local_380;
  char *local_368;
  size_t local_360;
  String local_358;
  char *local_340;
  size_t local_338;
  char *local_330;
  size_t local_328;
  char *local_320;
  size_t local_318;
  char *local_310;
  size_t local_308;
  char *local_300;
  size_t local_2f8;
  char *local_2f0;
  size_t local_2e8;
  char *local_2e0;
  size_t local_2d8;
  String local_2d0;
  char *local_2b8;
  size_t local_2b0;
  char *local_2a8;
  size_t local_2a0;
  char *local_298;
  size_t local_290;
  char *local_288;
  size_t local_280;
  CappedArray<char,_14UL> local_278;
  char *local_260;
  size_t local_258;
  String local_250;
  char *local_238;
  size_t local_230;
  char *local_228;
  size_t local_220;
  char *local_218;
  size_t local_210;
  char *local_208;
  size_t local_200;
  char *local_1f8;
  size_t local_1f0;
  char *local_1e8;
  size_t local_1e0;
  char *local_1c8;
  size_t local_1c0;
  String local_1b8;
  ArrayPtr<const_char> local_1a0;
  ArrayPtr<const_char> local_190;
  CappedArray<char,_14UL> local_180;
  ArrayPtr<const_char> local_168;
  ArrayPtr<const_char> local_158;
  ArrayPtr<const_char> local_148;
  ArrayPtr<const_char> local_138;
  ArrayPtr<const_char> local_128;
  ArrayPtr<const_char> local_118;
  ArrayPtr<const_char> local_108;
  ArrayPtr<const_char> local_f8;
  CappedArray<char,_14UL> local_e8;
  ArrayPtr<const_char> local_d0;
  ArrayPtr<const_char> local_c0;
  ArrayPtr<const_char> local_b0;
  ArrayPtr<const_char> local_a0;
  ArrayPtr<const_char> local_90;
  ArrayPtr<const_char> local_80;
  ArrayPtr<const_char> local_70;
  char (*local_60) [12];
  char (*params_local_4) [12];
  StringPtr *params_local_3;
  char (*params_local_2) [13];
  StringTree *params_local_1;
  StringTree *params_local;
  
  local_6c0 = __return_storage_ptr__;
  local_6b8 = __return_storage_ptr__;
  local_60 = params_3;
  params_local_4 = params_2;
  params_local_3 = params_1;
  params_local_2 = params;
  params_local_1 = (StringTree *)this;
  params_local = __return_storage_ptr__;
  pSVar1 = fwd<kj::StringTree>((NoInfer<kj::StringTree> *)this);
  local_6b0 = _::toStringTreeOrCharSequence(pSVar1);
  pSVar1 = fwd<kj::StringTree>((NoInfer<kj::StringTree> *)params_local_2);
  local_6a8 = _::toStringTreeOrCharSequence(pSVar1);
  pacVar2 = ::const((char (*) [13])params_local_3);
  local_70 = _::toStringTreeOrCharSequence<char_const(&)[13]>(pacVar2);
  pSVar3 = fwd<kj::StringPtr&>((StringPtr *)params_local_4);
  local_80 = _::toStringTreeOrCharSequence<kj::StringPtr&>(pSVar3);
  pacVar4 = ::const(local_60);
  local_90 = _::toStringTreeOrCharSequence<char_const(&)[12]>(pacVar4);
  pSVar5 = fwd<kj::String&>(params_4);
  local_a0 = _::toStringTreeOrCharSequence<kj::String&>(pSVar5);
  pacVar4 = ::const(params_5);
  local_b0 = _::toStringTreeOrCharSequence<char_const(&)[12]>(pacVar4);
  pSVar5 = fwd<kj::String&>(params_6);
  local_c0 = _::toStringTreeOrCharSequence<kj::String&>(pSVar5);
  pacVar6 = ::const(params_7);
  local_d0 = _::toStringTreeOrCharSequence<char_const(&)[59]>(pacVar6);
  p_Var7 = (_ *)fwd<unsigned_int&>(params_8);
  _::toStringTreeOrCharSequence<unsigned_int&>(&local_e8,p_Var7,value_08);
  pacVar8 = ::const(params_9);
  local_f8 = _::toStringTreeOrCharSequence<char_const(&)[38]>(pacVar8);
  pSVar1 = fwd<kj::StringTree>(params_10);
  local_6a0 = _::toStringTreeOrCharSequence(pSVar1);
  pacVar2 = ::const(params_11);
  local_108 = _::toStringTreeOrCharSequence<char_const(&)[13]>(pacVar2);
  pSVar3 = fwd<kj::StringPtr&>(params_12);
  local_118 = _::toStringTreeOrCharSequence<kj::StringPtr&>(pSVar3);
  pacVar2 = ::const(params_13);
  local_128 = _::toStringTreeOrCharSequence<char_const(&)[13]>(pacVar2);
  pSVar5 = fwd<kj::String&>(params_14);
  local_138 = _::toStringTreeOrCharSequence<kj::String&>(pSVar5);
  pacVar9 = ::const(params_15);
  local_148 = _::toStringTreeOrCharSequence<char_const(&)[6]>(pacVar9);
  pSVar5 = fwd<kj::String&>(params_16);
  local_158 = _::toStringTreeOrCharSequence<kj::String&>(pSVar5);
  pacVar10 = ::const(params_17);
  local_168 = _::toStringTreeOrCharSequence<char_const(&)[60]>(pacVar10);
  p_Var7 = (_ *)fwd<unsigned_int&>(params_18);
  _::toStringTreeOrCharSequence<unsigned_int&>(&local_180,p_Var7,value_09);
  pacVar8 = ::const(params_19);
  local_190 = _::toStringTreeOrCharSequence<char_const(&)[38]>(pacVar8);
  pSVar1 = fwd<kj::StringTree>(params_20);
  local_698 = _::toStringTreeOrCharSequence(pSVar1);
  pSVar1 = fwd<kj::StringTree>(params_21);
  local_690 = _::toStringTreeOrCharSequence(pSVar1);
  pacVar11 = ::const(params_22);
  local_1a0 = _::toStringTreeOrCharSequence<char_const(&)[8]>(pacVar11);
  pCVar12 = fwd<capnp::(anonymous_namespace)::CppTypeName&>(params_23);
  _::toStringTreeOrCharSequence<capnp::(anonymous_namespace)::CppTypeName&>
            (&local_1b8,(_ *)pCVar12,value_10);
  pacVar13 = ::const(params_24);
  AVar18 = _::toStringTreeOrCharSequence<char_const(&)[2]>(pacVar13);
  local_688 = AVar18.size_;
  local_680 = AVar18.ptr;
  local_1c8 = local_680;
  local_1c0 = local_688;
  pSVar3 = fwd<kj::StringPtr&>(params_25);
  AVar18 = _::toStringTreeOrCharSequence<kj::StringPtr&>(pSVar3);
  local_6d0 = AVar18.size_;
  local_6c8 = AVar18.ptr;
  local_1e8 = local_6c8;
  local_1e0 = local_6d0;
  pacVar4 = ::const(params_26);
  AVar18 = _::toStringTreeOrCharSequence<char_const(&)[12]>(pacVar4);
  local_6e0 = AVar18.size_;
  local_6d8 = AVar18.ptr;
  local_1f8 = local_6d8;
  local_1f0 = local_6e0;
  pSVar5 = fwd<kj::String&>(params_27);
  AVar18 = _::toStringTreeOrCharSequence<kj::String&>(pSVar5);
  local_6f0 = AVar18.size_;
  local_6e8 = AVar18.ptr;
  local_208 = local_6e8;
  local_200 = local_6f0;
  pacVar4 = ::const(params_28);
  AVar18 = _::toStringTreeOrCharSequence<char_const(&)[12]>(pacVar4);
  local_700 = AVar18.size_;
  local_6f8 = AVar18.ptr;
  local_218 = local_6f8;
  local_210 = local_700;
  pSVar5 = fwd<kj::String&>(params_29);
  AVar18 = _::toStringTreeOrCharSequence<kj::String&>(pSVar5);
  local_710 = AVar18.size_;
  local_708 = AVar18.ptr;
  local_228 = local_708;
  local_220 = local_710;
  pacVar14 = ::const(params_30);
  AVar18 = _::toStringTreeOrCharSequence<char_const(&)[37]>(pacVar14);
  local_720 = AVar18.size_;
  local_718 = AVar18.ptr;
  local_238 = local_718;
  local_230 = local_720;
  pCVar12 = fwd<capnp::(anonymous_namespace)::CppTypeName&>(params_31);
  _::toStringTreeOrCharSequence<capnp::(anonymous_namespace)::CppTypeName&>
            (&local_250,(_ *)pCVar12,value_11);
  value = ::const(params_32);
  AVar18 = _::toStringTreeOrCharSequence<char_const(&)[56]>(value);
  local_730 = AVar18.size_;
  local_728 = AVar18.ptr;
  local_260 = local_728;
  local_258 = local_730;
  p_Var7 = (_ *)fwd<unsigned_int&>(params_33);
  _::toStringTreeOrCharSequence<unsigned_int&>(&local_278,p_Var7,value_12);
  pacVar15 = ::const(params_34);
  AVar18 = _::toStringTreeOrCharSequence<char_const(&)[25]>(pacVar15);
  local_740 = AVar18.size_;
  local_738 = AVar18.ptr;
  local_288 = local_738;
  local_280 = local_740;
  pSVar5 = fwd<kj::String&>(params_35);
  AVar18 = _::toStringTreeOrCharSequence<kj::String&>(pSVar5);
  local_750 = AVar18.size_;
  local_748 = AVar18.ptr;
  local_298 = local_748;
  local_290 = local_750;
  pacVar9 = ::const(params_36);
  AVar18 = _::toStringTreeOrCharSequence<char_const(&)[6]>(pacVar9);
  local_760 = AVar18.size_;
  local_758 = AVar18.ptr;
  local_2a8 = local_758;
  local_2a0 = local_760;
  pSVar1 = fwd<kj::StringTree>(params_37);
  local_778 = _::toStringTreeOrCharSequence(pSVar1);
  pacVar11 = ::const(params_38);
  AVar18 = _::toStringTreeOrCharSequence<char_const(&)[8]>(pacVar11);
  local_770 = AVar18.size_;
  local_768 = AVar18.ptr;
  local_2b8 = local_768;
  local_2b0 = local_770;
  pCVar12 = fwd<capnp::(anonymous_namespace)::CppTypeName&>(params_39);
  _::toStringTreeOrCharSequence<capnp::(anonymous_namespace)::CppTypeName&>
            (&local_2d0,(_ *)pCVar12,value_13);
  pacVar13 = ::const(params_40);
  AVar18 = _::toStringTreeOrCharSequence<char_const(&)[2]>(pacVar13);
  local_788 = AVar18.size_;
  local_780 = AVar18.ptr;
  local_2e0 = local_780;
  local_2d8 = local_788;
  pSVar3 = fwd<kj::StringPtr&>(params_41);
  AVar18 = _::toStringTreeOrCharSequence<kj::StringPtr&>(pSVar3);
  local_798 = AVar18.size_;
  local_790 = AVar18.ptr;
  local_2f0 = local_790;
  local_2e8 = local_798;
  pacVar2 = ::const(params_42);
  AVar18 = _::toStringTreeOrCharSequence<char_const(&)[13]>(pacVar2);
  local_7a8 = AVar18.size_;
  local_7a0 = AVar18.ptr;
  local_300 = local_7a0;
  local_2f8 = local_7a8;
  pSVar5 = fwd<kj::String&>(params_43);
  AVar18 = _::toStringTreeOrCharSequence<kj::String&>(pSVar5);
  local_7b8 = AVar18.size_;
  local_7b0 = AVar18.ptr;
  local_310 = local_7b0;
  local_308 = local_7b8;
  pacVar9 = ::const(params_44);
  AVar18 = _::toStringTreeOrCharSequence<char_const(&)[6]>(pacVar9);
  local_7c8 = AVar18.size_;
  local_7c0 = AVar18.ptr;
  local_320 = local_7c0;
  local_318 = local_7c8;
  pSVar5 = fwd<kj::String&>(params_45);
  AVar18 = _::toStringTreeOrCharSequence<kj::String&>(pSVar5);
  local_7d8 = AVar18.size_;
  local_7d0 = AVar18.ptr;
  local_330 = local_7d0;
  local_328 = local_7d8;
  pacVar14 = ::const(params_46);
  AVar18 = _::toStringTreeOrCharSequence<char_const(&)[37]>(pacVar14);
  local_7e8 = AVar18.size_;
  local_7e0 = AVar18.ptr;
  local_340 = local_7e0;
  local_338 = local_7e8;
  pCVar12 = fwd<capnp::(anonymous_namespace)::CppTypeName&>(params_47);
  _::toStringTreeOrCharSequence<capnp::(anonymous_namespace)::CppTypeName&>
            (&local_358,(_ *)pCVar12,value_14);
  pacVar16 = ::const(params_48);
  AVar18 = _::toStringTreeOrCharSequence<char_const(&)[57]>(pacVar16);
  local_7f8 = AVar18.size_;
  local_7f0 = AVar18.ptr;
  local_368 = local_7f0;
  local_360 = local_7f8;
  p_Var7 = (_ *)fwd<unsigned_int&>(params_49);
  _::toStringTreeOrCharSequence<unsigned_int&>(&local_380,p_Var7,value_15);
  pacVar15 = ::const(params_50);
  AVar18 = _::toStringTreeOrCharSequence<char_const(&)[25]>(pacVar15);
  local_808 = AVar18.size_;
  local_800 = AVar18.ptr;
  local_390 = local_800;
  local_388 = local_808;
  pSVar5 = fwd<kj::String&>(params_51);
  AVar18 = _::toStringTreeOrCharSequence<kj::String&>(pSVar5);
  local_818 = AVar18.size_;
  local_810 = AVar18.ptr;
  local_3a0 = local_810;
  local_398 = local_818;
  pacVar9 = ::const(params_52);
  AVar18 = _::toStringTreeOrCharSequence<char_const(&)[6]>(pacVar9);
  local_828 = AVar18.size_;
  local_820 = AVar18.ptr;
  local_3b0 = local_820;
  local_3a8 = local_828;
  pSVar1 = fwd<kj::StringTree>(params_53);
  local_848 = _::toStringTreeOrCharSequence(pSVar1);
  pSVar1 = fwd<kj::StringTree>(params_54);
  local_840 = _::toStringTreeOrCharSequence(pSVar1);
  pacVar2 = ::const(params_55);
  AVar18 = _::toStringTreeOrCharSequence<char_const(&)[13]>(pacVar2);
  local_838 = AVar18.size_;
  local_830 = AVar18.ptr;
  local_3c0 = local_830;
  local_3b8 = local_838;
  pSVar3 = fwd<kj::StringPtr&>(params_56);
  AVar18 = _::toStringTreeOrCharSequence<kj::StringPtr&>(pSVar3);
  local_858 = AVar18.size_;
  local_850 = AVar18.ptr;
  local_3d0 = local_850;
  local_3c8 = local_858;
  pacVar2 = ::const(params_57);
  AVar18 = _::toStringTreeOrCharSequence<char_const(&)[13]>(pacVar2);
  local_868 = AVar18.size_;
  local_860 = AVar18.ptr;
  local_3e0 = local_860;
  local_3d8 = local_868;
  pSVar5 = fwd<kj::String&>(params_58);
  AVar18 = _::toStringTreeOrCharSequence<kj::String&>(pSVar5);
  local_878 = AVar18.size_;
  local_870 = AVar18.ptr;
  local_3f0 = local_870;
  local_3e8 = local_878;
  pacVar13 = ::const(params_59);
  AVar18 = _::toStringTreeOrCharSequence<char_const(&)[2]>(pacVar13);
  local_888 = AVar18.size_;
  local_880 = AVar18.ptr;
  local_400 = local_880;
  local_3f8 = local_888;
  pCVar12 = fwd<capnp::(anonymous_namespace)::CppTypeName&>(params_60);
  _::toStringTreeOrCharSequence<capnp::(anonymous_namespace)::CppTypeName&>
            (&local_418,(_ *)pCVar12,value_16);
  value_00 = ::const(params_61);
  AVar18 = _::toStringTreeOrCharSequence<char_const(&)[11]>(value_00);
  local_898 = AVar18.size_;
  local_890 = AVar18.ptr;
  local_428 = local_890;
  local_420 = local_898;
  pSVar5 = fwd<kj::String&>(params_62);
  AVar18 = _::toStringTreeOrCharSequence<kj::String&>(pSVar5);
  local_8a8 = AVar18.size_;
  local_8a0 = AVar18.ptr;
  local_438 = local_8a0;
  local_430 = local_8a8;
  pacVar17 = ::const(params_63);
  AVar18 = _::toStringTreeOrCharSequence<char_const(&)[30]>(pacVar17);
  local_8b8 = AVar18.size_;
  local_8b0 = AVar18.ptr;
  local_448 = local_8b0;
  local_440 = local_8b8;
  pCVar12 = fwd<capnp::(anonymous_namespace)::CppTypeName&>(params_64);
  _::toStringTreeOrCharSequence<capnp::(anonymous_namespace)::CppTypeName&>
            (&local_460,(_ *)pCVar12,value_17);
  pacVar16 = ::const(params_65);
  AVar18 = _::toStringTreeOrCharSequence<char_const(&)[57]>(pacVar16);
  local_8c8 = AVar18.size_;
  local_8c0 = AVar18.ptr;
  local_470 = local_8c0;
  local_468 = local_8c8;
  p_Var7 = (_ *)fwd<unsigned_int&>(in_stack_000001f8);
  _::toStringTreeOrCharSequence<unsigned_int&>(&local_488,p_Var7,value_18);
  pacVar14 = ::const(in_stack_00000200);
  AVar18 = _::toStringTreeOrCharSequence<char_const(&)[37]>(pacVar14);
  local_8d8 = AVar18.size_;
  local_8d0 = AVar18.ptr;
  local_498 = local_8d0;
  local_490 = local_8d8;
  pSVar1 = fwd<kj::StringTree>(in_stack_00000208);
  local_908 = _::toStringTreeOrCharSequence(pSVar1);
  pSVar1 = fwd<kj::StringTree>(in_stack_00000210);
  local_900 = _::toStringTreeOrCharSequence(pSVar1);
  pSVar1 = fwd<kj::StringTree>(in_stack_00000218);
  local_8f8 = _::toStringTreeOrCharSequence(pSVar1);
  pSVar1 = fwd<kj::StringTree>(in_stack_00000220);
  local_8f0 = _::toStringTreeOrCharSequence(pSVar1);
  pacVar2 = ::const(in_stack_00000228);
  AVar18 = _::toStringTreeOrCharSequence<char_const(&)[13]>(pacVar2);
  local_8e8 = AVar18.size_;
  local_8e0 = AVar18.ptr;
  local_4a8 = local_8e0;
  local_4a0 = local_8e8;
  pSVar3 = fwd<kj::StringPtr&>(in_stack_00000230);
  AVar18 = _::toStringTreeOrCharSequence<kj::StringPtr&>(pSVar3);
  local_918 = AVar18.size_;
  local_910 = AVar18.ptr;
  local_4b8 = local_910;
  local_4b0 = local_918;
  value_01 = ::const(in_stack_00000238);
  AVar18 = _::toStringTreeOrCharSequence<char_const(&)[15]>(value_01);
  local_928 = AVar18.size_;
  local_920 = AVar18.ptr;
  local_4c8 = local_920;
  local_4c0 = local_928;
  pSVar5 = fwd<kj::String&>(in_stack_00000240);
  AVar18 = _::toStringTreeOrCharSequence<kj::String&>(pSVar5);
  local_938 = AVar18.size_;
  local_930 = AVar18.ptr;
  local_4d8 = local_930;
  local_4d0 = local_938;
  value_02 = ::const(in_stack_00000248);
  AVar18 = _::toStringTreeOrCharSequence<char_const(&)[23]>(value_02);
  local_948 = AVar18.size_;
  local_940 = AVar18.ptr;
  local_4e8 = local_940;
  local_4e0 = local_948;
  pCVar12 = fwd<capnp::(anonymous_namespace)::CppTypeName&>(in_stack_00000250);
  _::toStringTreeOrCharSequence<capnp::(anonymous_namespace)::CppTypeName&>
            (&local_500,(_ *)pCVar12,value_19);
  value_03 = ::const(in_stack_00000258);
  AVar18 = _::toStringTreeOrCharSequence<char_const(&)[14]>(value_03);
  local_958 = AVar18.size_;
  local_950 = AVar18.ptr;
  local_510 = local_950;
  local_508 = local_958;
  pSVar5 = fwd<kj::String&>(in_stack_00000260);
  AVar18 = _::toStringTreeOrCharSequence<kj::String&>(pSVar5);
  local_968 = AVar18.size_;
  local_960 = AVar18.ptr;
  local_520 = local_960;
  local_518 = local_968;
  pacVar17 = ::const(in_stack_00000268);
  AVar18 = _::toStringTreeOrCharSequence<char_const(&)[30]>(pacVar17);
  local_978 = AVar18.size_;
  local_970 = AVar18.ptr;
  local_530 = local_970;
  local_528 = local_978;
  pCVar12 = fwd<capnp::(anonymous_namespace)::CppTypeName&>(in_stack_00000270);
  _::toStringTreeOrCharSequence<capnp::(anonymous_namespace)::CppTypeName&>
            (&local_548,(_ *)pCVar12,value_20);
  pacVar6 = ::const(in_stack_00000278);
  AVar18 = _::toStringTreeOrCharSequence<char_const(&)[59]>(pacVar6);
  local_988 = AVar18.size_;
  local_980 = AVar18.ptr;
  local_558 = local_980;
  local_550 = local_988;
  p_Var7 = (_ *)fwd<unsigned_int&>(in_stack_00000280);
  _::toStringTreeOrCharSequence<unsigned_int&>(&local_570,p_Var7,value_21);
  value_04 = ::const(in_stack_00000288);
  AVar18 = _::toStringTreeOrCharSequence<char_const(&)[45]>(value_04);
  local_998 = AVar18.size_;
  local_990 = AVar18.ptr;
  local_580 = local_990;
  local_578 = local_998;
  pSVar1 = fwd<kj::StringTree>(in_stack_00000290);
  local_9b8 = _::toStringTreeOrCharSequence(pSVar1);
  pSVar1 = fwd<kj::StringTree>(in_stack_00000298);
  local_9b0 = _::toStringTreeOrCharSequence(pSVar1);
  value_05 = ::const(in_stack_000002a0);
  AVar18 = _::toStringTreeOrCharSequence<char_const(&)[24]>(value_05);
  local_9a8 = AVar18.size_;
  local_9a0 = AVar18.ptr;
  local_590 = local_9a0;
  local_588 = local_9a8;
  pCVar12 = fwd<capnp::(anonymous_namespace)::CppTypeName&>(in_stack_000002a8);
  _::toStringTreeOrCharSequence<capnp::(anonymous_namespace)::CppTypeName&>
            (&local_5a8,(_ *)pCVar12,value_22);
  value_06 = ::const(in_stack_000002b0);
  AVar18 = _::toStringTreeOrCharSequence<char_const(&)[3]>(value_06);
  local_9c8 = AVar18.size_;
  local_9c0 = AVar18.ptr;
  local_5b8 = local_9c0;
  local_5b0 = local_9c8;
  pSVar3 = fwd<kj::StringPtr&>(in_stack_000002b8);
  AVar18 = _::toStringTreeOrCharSequence<kj::StringPtr&>(pSVar3);
  local_9d8 = AVar18.size_;
  local_9d0 = AVar18.ptr;
  local_5c8 = local_9d0;
  local_5c0 = local_9d8;
  value_07 = ::const(in_stack_000002c0);
  AVar18 = _::toStringTreeOrCharSequence<char_const(&)[16]>(value_07);
  local_9e8 = AVar18.size_;
  local_9e0 = AVar18.ptr;
  local_5d8 = local_9e0;
  local_5d0 = local_9e8;
  pSVar5 = fwd<kj::String&>(in_stack_000002c8);
  AVar18 = _::toStringTreeOrCharSequence<kj::String&>(pSVar5);
  local_9f8 = AVar18.size_;
  local_9f0 = AVar18.ptr;
  local_5e8 = local_9f0;
  local_5e0 = local_9f8;
  pacVar9 = ::const(in_stack_000002d0);
  AVar18 = _::toStringTreeOrCharSequence<char_const(&)[6]>(pacVar9);
  local_a08 = AVar18.size_;
  local_a00 = AVar18.ptr;
  local_5f8 = local_a00;
  local_5f0 = local_a08;
  pSVar5 = fwd<kj::String&>(in_stack_000002d8);
  AVar18 = _::toStringTreeOrCharSequence<kj::String&>(pSVar5);
  local_a18 = AVar18.size_;
  local_a10 = AVar18.ptr;
  local_608 = local_a10;
  local_600 = local_a18;
  pacVar14 = ::const(in_stack_000002e0);
  AVar18 = _::toStringTreeOrCharSequence<char_const(&)[37]>(pacVar14);
  local_a28 = AVar18.size_;
  local_a20 = AVar18.ptr;
  local_618 = local_a20;
  local_610 = local_a28;
  pCVar12 = fwd<capnp::(anonymous_namespace)::CppTypeName&>(in_stack_000002e8);
  _::toStringTreeOrCharSequence<capnp::(anonymous_namespace)::CppTypeName&>
            (&local_630,(_ *)pCVar12,value_23);
  pacVar10 = ::const(in_stack_000002f0);
  AVar18 = _::toStringTreeOrCharSequence<char_const(&)[60]>(pacVar10);
  local_a38 = AVar18.size_;
  local_a30 = AVar18.ptr;
  local_640 = local_a30;
  local_638 = local_a38;
  p_Var7 = (_ *)fwd<unsigned_int&>(in_stack_000002f8);
  _::toStringTreeOrCharSequence<unsigned_int&>(&local_658,p_Var7,value_24);
  pacVar17 = ::const(in_stack_00000300);
  AVar18 = _::toStringTreeOrCharSequence<char_const(&)[30]>(pacVar17);
  local_a48 = AVar18.size_;
  local_a40 = AVar18.ptr;
  local_668 = local_a40;
  local_660 = local_a48;
  pSVar1 = fwd<kj::StringTree>(in_stack_00000308);
  local_a68 = _::toStringTreeOrCharSequence(pSVar1);
  pSVar1 = fwd<kj::StringTree>(in_stack_00000310);
  local_a60 = _::toStringTreeOrCharSequence(pSVar1);
  pacVar13 = ::const(in_stack_00000318);
  AVar18 = _::toStringTreeOrCharSequence<char_const(&)[2]>(pacVar13);
  local_a58 = AVar18.size_;
  local_a50 = AVar18.ptr;
  local_a78 = &local_678;
  local_a80 = local_a60;
  local_a88 = local_a68;
  local_a90 = &local_668;
  local_a98 = &local_658;
  local_aa0 = &local_640;
  local_aa8 = &local_630;
  local_ab0 = &local_618;
  local_ab8 = &local_608;
  local_ac0 = &local_5f8;
  local_ac8 = &local_5e8;
  local_ad0 = &local_5d8;
  local_ad8 = &local_5c8;
  local_ae0 = &local_5b8;
  local_ae8 = &local_5a8;
  local_af0 = &local_590;
  local_af8 = local_9b0;
  local_b00 = local_9b8;
  local_b08 = &local_580;
  local_b10 = &local_570;
  local_b18 = &local_558;
  local_b20 = &local_548;
  local_b28 = &local_530;
  local_b30 = &local_520;
  local_b38 = &local_510;
  local_b40 = &local_500;
  local_b48 = &local_4e8;
  local_b50 = &local_4d8;
  local_b58 = &local_4c8;
  local_b60 = &local_4b8;
  local_b68 = &local_4a8;
  local_b70 = local_8f0;
  local_b78 = local_8f8;
  local_b80 = local_900;
  local_b88 = local_908;
  local_b90 = &local_498;
  local_b98 = &local_488;
  local_ba0 = &local_470;
  local_ba8 = &local_460;
  local_bb0 = &local_448;
  local_bb8 = &local_438;
  local_bc0 = &local_428;
  local_bc8 = &local_418;
  local_bd0 = &local_400;
  local_bd8 = &local_3f0;
  local_be0 = &local_3e0;
  local_be8 = &local_3d0;
  local_bf0 = &local_3c0;
  local_bf8 = local_840;
  local_c00 = local_848;
  local_c08 = &local_3b0;
  local_c10 = &local_3a0;
  local_c18 = &local_390;
  local_c20 = &local_380;
  local_c28 = &local_368;
  local_c30 = &local_358;
  local_c38 = &local_340;
  local_c40 = &local_330;
  local_c48 = &local_320;
  local_c50 = &local_310;
  local_c58 = &local_300;
  local_c60 = &local_2f0;
  local_c68 = &local_2e0;
  local_c70 = &local_2d0;
  local_c78 = &local_2b8;
  local_c80 = local_778;
  local_c88 = &local_2a8;
  local_c90 = &local_298;
  local_c98 = &local_288;
  local_ca0 = &local_278;
  local_ca8 = &local_260;
  local_cb0 = &local_250;
  local_cb8 = &local_238;
  local_cc0 = &local_228;
  local_cc8 = &local_218;
  local_cd0 = &local_208;
  local_cd8 = &local_1f8;
  local_ce0 = &local_1e8;
  local_ce8 = &local_1c8;
  local_cf0 = &local_1b8;
  local_cf8 = &local_1a0;
  local_d00 = local_690;
  local_d08 = local_698;
  local_d10 = &local_190;
  local_d18 = &local_180;
  local_d20 = &local_168;
  local_d28 = &local_158;
  local_d30 = &local_148;
  local_d38 = &local_138;
  local_d40 = &local_128;
  local_d48 = &local_118;
  local_d50 = &local_108;
  local_d58 = local_6a0;
  local_d60 = &local_f8;
  local_d68 = &local_e8;
  local_d70 = &local_d0;
  local_d78 = &local_c0;
  local_d80 = &local_b0;
  local_d88 = &local_a0;
  local_a70 = (undefined1 *)&local_d88;
  local_678 = local_a50;
  local_670 = local_a58;
  StringTree::
  concat<kj::StringTree,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringTree,kj::StringTree,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<c___pedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringTree,kj::StringTree,kj::ArrayPtr<char_const>>
            (local_6c0,local_6b0,local_6a8,&local_70,&local_80,&local_90);
  String::~String(&local_630);
  String::~String(&local_5a8);
  String::~String(&local_548);
  String::~String(&local_500);
  String::~String(&local_460);
  String::~String(&local_418);
  String::~String(&local_358);
  String::~String(&local_2d0);
  String::~String(&local_250);
  String::~String(&local_1b8);
  return local_6b8;
}

Assistant:

StringTree strTree(Params&&... params) {
  return StringTree::concat(_::toStringTreeOrCharSequence(kj::fwd<Params>(params))...);
}